

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

ulong __thiscall nuraft::raft_server::term_for_log(raft_server *this,ulong log_idx)

{
  element_type *peVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 uVar7;
  int iVar8;
  ptr<snapshot> last_snapshot;
  string local_50;
  ulong *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  if (log_idx == 0) {
    uVar6 = 0;
  }
  else {
    uVar5 = (**(code **)(*(long *)(this->log_store_).
                                  super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr + 0x18))();
    if (uVar5 <= log_idx) {
      peVar1 = (this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      uVar6 = (**(code **)(*(long *)peVar1 + 0x58))(peVar1,log_idx);
      return uVar6;
    }
    (**(code **)(*(long *)(this->state_machine_).
                          super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 0x80))(&local_30);
    if ((local_30 == (ulong *)0x0) || (*local_30 != log_idx)) {
      if (term_for_log(unsigned_long)::bad_log_timer == '\0') {
        iVar8 = __cxa_guard_acquire(&term_for_log(unsigned_long)::bad_log_timer);
        if (iVar8 != 0) {
          term_for_log::bad_log_timer.t_created_.__d.__r = (duration)0;
          term_for_log::bad_log_timer.duration_us_ = 1000000;
          term_for_log::bad_log_timer.first_event_fired_ = false;
          term_for_log::bad_log_timer.lock_.super___mutex_base._M_mutex.__align = 0;
          term_for_log::bad_log_timer.lock_.super___mutex_base._M_mutex._8_8_ = 0;
          term_for_log::bad_log_timer.lock_.super___mutex_base._M_mutex._16_8_ = 0;
          term_for_log::bad_log_timer.lock_.super___mutex_base._M_mutex.__data.__list.__prev =
               (__pthread_internal_list *)0x0;
          term_for_log::bad_log_timer.lock_.super___mutex_base._M_mutex.__data.__list.__next =
               (__pthread_internal_list *)0x0;
          timer_helper::reset(&term_for_log::bad_log_timer);
          __cxa_guard_release(&term_for_log(unsigned_long)::bad_log_timer);
        }
      }
      bVar3 = timer_helper::timeout_and_reset(&term_for_log::bad_log_timer);
      iVar8 = (uint)!bVar3 * 4 + 2;
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar4 = (**(code **)(*(long *)peVar2 + 0x38))();
        if (iVar8 <= iVar4) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_50,
                     "bad log_idx %lu for retrieving the term value, will ignore this log req",
                     log_idx);
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,iVar8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"term_for_log",0x601,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
      }
      if ((local_30 != (ulong *)0x0) &&
         (peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
         peVar2 != (element_type *)0x0)) {
        iVar4 = (**(code **)(*(long *)peVar2 + 0x38))();
        if (iVar8 <= iVar4) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_50,"last snapshot %p, log_idx %lu, snapshot last_log_idx %lu\n",local_30
                     ,log_idx,*local_30);
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,iVar8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"term_for_log",0x605,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
      }
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar4 = (**(code **)(*(long *)peVar2 + 0x38))();
        if (iVar8 <= iVar4) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar7 = (**(code **)(*(long *)(this->log_store_).
                                        super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 0x18))();
          msg_if_given_abi_cxx11_(&local_50,"log_store_->start_index() %lu",uVar7);
          (**(code **)(*(long *)peVar2 + 0x40))
                    (peVar2,iVar8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"term_for_log",0x607,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
      }
      uVar6 = 0;
    }
    else {
      uVar6 = local_30[1];
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
  }
  return uVar6;
}

Assistant:

ulong raft_server::term_for_log(ulong log_idx) {
    if (log_idx == 0) {
        return 0L;
    }

    if (log_idx >= log_store_->start_index()) {
        return log_store_->term_at(log_idx);
    }

    ptr<snapshot> last_snapshot(state_machine_->last_snapshot());
    if ( !last_snapshot || log_idx != last_snapshot->get_last_log_idx() ) {
        static timer_helper bad_log_timer(1000000, true);
        int log_lv = bad_log_timer.timeout_and_reset() ? L_ERROR : L_TRACE;

        p_lv(log_lv, "bad log_idx %" PRIu64 " for retrieving the term value, "
             "will ignore this log req", log_idx);
        if (last_snapshot) {
            p_lv(log_lv, "last snapshot %p, log_idx %" PRIu64
                 ", snapshot last_log_idx %" PRIu64 "\n",
                 last_snapshot.get(), log_idx, last_snapshot->get_last_log_idx());
        }
        p_lv(log_lv, "log_store_->start_index() %" PRIu64, log_store_->start_index());
        //ctx_->state_mgr_->system_exit(raft_err::N19_bad_log_idx_for_term);
        //::exit(-1);
        return 0L;
    }

    return last_snapshot->get_last_log_term();
}